

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void (anonymous_namespace)::testDiskAttrValue<Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>>
               (Header *diskHeader,TypedAttribute<Imf_2_5::TimeCode> *testAttribute)

{
  bool bVar1;
  Attribute *pAVar2;
  TypedAttribute<Imf_2_5::TimeCode> *this;
  TimeCode *this_00;
  TimeCode *c;
  InputExc *this_01;
  TypedAttribute<Imf_2_5::TimeCode> *in_RSI;
  TypedAttribute<Imf_2_5::TimeCode> *diskAttr;
  string *attrName;
  string *in_stack_ffffffffffffff68;
  undefined7 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff77;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  TypedAttribute<Imf_2_5::TimeCode> *local_10;
  
  local_10 = in_RSI;
  (*(in_RSI->super_Attribute)._vptr_Attribute[2])();
  __a = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__a);
  std::allocator<char>::~allocator(&local_39);
  local_18 = local_38;
  pAVar2 = Imf_2_5::Header::operator[]
                     ((Header *)CONCAT17(in_stack_ffffffffffffff77,in_stack_ffffffffffffff70),
                      in_stack_ffffffffffffff68);
  this = (TypedAttribute<Imf_2_5::TimeCode> *)
         __dynamic_cast(pAVar2,&Imf_2_5::Attribute::typeinfo,
                        &Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::typeinfo,0);
  if (this == (TypedAttribute<Imf_2_5::TimeCode> *)0x0) {
    __cxa_bad_cast();
  }
  this_00 = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::value(this);
  c = Imf_2_5::TypedAttribute<Imf_2_5::TimeCode>::value(local_10);
  bVar1 = Imf_2_5::TimeCode::operator!=(this_00,c);
  if (!bVar1) {
    std::__cxx11::string::~string(local_38);
    return;
  }
  this_01 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_2_5::InputExc::InputExc(this_01,"incorrect value from disk");
  __cxa_throw(this_01,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

void
testDiskAttrValue (const Header & diskHeader, const T & testAttribute)
{
    const string & attrName = testAttribute.typeName();
    const T & diskAttr = dynamic_cast <const T &> (diskHeader[attrName]);
    if (diskAttr.value() != testAttribute.value())
    {
        throw IEX_NAMESPACE::InputExc ("incorrect value from disk");
    }

    return;
}